

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O0

void __thiscall DataBuffer::DataBuffer(DataBuffer *this,int size)

{
  char *pcVar1;
  char **ppcVar2;
  ulong uVar3;
  int size_local;
  DataBuffer *this_local;
  
  uVar3 = (ulong)size;
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar3);
  this->m_buffer = pcVar1;
  this->m_allocatedSize = size;
  ppcVar2 = buffer(this);
  this->m_position = *ppcVar2;
  List<ByteMark_*>::List(&this->m_marks);
  List<MarkReference_*>::List(&this->m_references);
  return;
}

Assistant:

DataBuffer::DataBuffer (int size) :
	m_buffer (new char[size]),
	m_allocatedSize (size),
	m_position (&buffer()[0]) {}